

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void dot(_Bool canAssign)

{
  uint8_t byte2;
  _Bool _Var1;
  uint8_t byte;
  undefined7 in_register_00000039;
  uint8_t uStack_20;
  
  consume(TOKEN_IDENTIFIER,"Expect property name after \'.\'.");
  byte2 = identifierConstant(&parser.previous);
  if ((int)CONCAT71(in_register_00000039,canAssign) != 0) {
    _Var1 = match(TOKEN_EQUAL);
    if (_Var1) {
      expression();
      uStack_20 = '\r';
      goto LAB_001040fb;
    }
  }
  _Var1 = match(TOKEN_LEFT_PAREN);
  if (_Var1) {
    byte = argumentList();
    emitBytes('\x1d',byte2);
    emitByte(byte);
    return;
  }
  uStack_20 = '\f';
LAB_001040fb:
  emitBytes(uStack_20,byte2);
  return;
}

Assistant:

static void dot(bool canAssign) {
    consume(TOKEN_IDENTIFIER, "Expect property name after '.'.");
    uint8_t name = identifierConstant(&parser.previous);

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(OP_SET_PROPERTY, name);
    } else if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        emitBytes(OP_INVOKE, name);
        emitByte(argCount);
    }else {
        emitBytes(OP_GET_PROPERTY, name);
    }
}